

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_vector.hpp
# Opt level: O2

vector<short,_std::allocator<short>_> *
utility::random_vector<short>
          (vector<short,_std::allocator<short>_> *__return_storage_ptr__,size_t size,short min,
          short max)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  anon_class_16_2_a39a3d48 __gen;
  uniform_int_distribution<short> uniform;
  default_random_engine generator;
  allocator_type local_25;
  uniform_int_distribution<short> local_24;
  default_random_engine local_20;
  
  std::vector<short,_std::allocator<short>_>::vector(__return_storage_ptr__,size,&local_25);
  local_20._M_x = 1;
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __gen.generator = &local_20;
  __gen.uniform = &local_24;
  local_24._M_param._M_a = min;
  local_24._M_param._M_b = max;
  std::
  generate_n<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,unsigned_long,utility::random_vector<short>(unsigned_long,short,short)::_lambda()_1_>
            (__first,(long)(__return_storage_ptr__->
                           super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)__first._M_current >> 1,__gen);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integer> random_vector (std::size_t size, Integer min, Integer max)
    {
        std::vector<Integer> numbers(size);

        std::uniform_int_distribution<Integer> uniform(min, max);
        std::default_random_engine generator;

        std::generate_n(numbers.begin(), numbers.size(),
            [& uniform, & generator]
            {
                return uniform(generator);
            });

        return numbers;
    }